

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
* __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::operator=(token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            *this,token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *other)

{
  jsonpath_token_kind jVar1;
  selector_type *psVar2;
  selector_type *psVar3;
  
  if (other != this) {
    jVar1 = this->token_kind_;
    if (jVar1 == other->token_kind_) {
      switch(jVar1) {
      case literal:
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
                  (&(this->field_1).value_,&(other->field_1).value_);
        break;
      case selector:
      case function:
      case unary_operator:
      case binary_operator:
        (this->field_1).selector_ = (other->field_1).selector_;
        break;
      case end_function:
      case argument:
        break;
      default:
        if (jVar1 == expression) {
          psVar2 = (other->field_1).selector_;
          (other->field_1).selector_ = (selector_type *)0x0;
          psVar3 = (this->field_1).selector_;
          (this->field_1).selector_ = psVar2;
          if (psVar3 != (selector_type *)0x0) {
            (*psVar3->_vptr_jsonpath_selector[1])();
          }
        }
      }
    }
    else {
      destroy(this);
      construct(this,other);
    }
  }
  return this;
}

Assistant:

token& operator=(token&& other) noexcept
        {

            if (&other != this)
            {
                if (token_kind_ == other.token_kind_)
                {
                    switch (token_kind_)
                    {
                        case jsonpath_token_kind::selector:
                            selector_ = other.selector_;
                            break;
                        case jsonpath_token_kind::expression:
                            expression_ = std::move(other.expression_);
                            break;
                        case jsonpath_token_kind::unary_operator:
                            unary_operator_ = other.unary_operator_;
                            break;
                        case jsonpath_token_kind::binary_operator:
                            binary_operator_ = other.binary_operator_;
                            break;
                        case jsonpath_token_kind::function:
                            function_ = other.function_;
                            break;
                        case jsonpath_token_kind::literal:
                            value_ = std::move(other.value_);
                            break;
                        default:
                            break;
                    }
                }
                else
                {
                    destroy();
                    construct(std::move(other));
                }
            }
            return *this;
        }